

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O1

int cli_get_option_predicate(void *data)

{
  char *__s1;
  int iVar1;
  bool bVar2;
  
  __s1 = *data;
  if (g_cli_get_option_name == (char *)0x0 || __s1 == (char *)0x0) {
    bVar2 = __s1 == (char *)0x0 && g_cli_get_option_name == (char *)0x0;
  }
  else {
    iVar1 = strcmp(__s1,g_cli_get_option_name);
    bVar2 = iVar1 == 0;
  }
  return (int)bVar2;
}

Assistant:

static int cli_get_option_predicate(void *data)
{
	struct cli_option option = *(struct cli_option *)data;
	if (option.name != NULL && g_cli_get_option_name != NULL) {
		return strcmp(option.name, g_cli_get_option_name) == 0;
	}
	if (option.name != NULL || g_cli_get_option_name != NULL) {
		return 0;
	}
	return 1;
}